

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O2

bool ft::operator<(deque<int,_ft::allocator<int>_> *lhs,deque<int,_ft::allocator<int>_> *rhs)

{
  bool bVar1;
  constDequeIterator<int,_64UL> local_d0;
  constDequeIterator<int,_64UL> local_a8;
  constDequeIterator<int,_64UL> local_80;
  constDequeIterator<int,_64UL> local_58;
  
  constDequeIterator<int,_64UL>::constDequeIterator(&local_d0,&lhs->m_start);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_a8,&lhs->m_finish);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_80,&rhs->m_start);
  constDequeIterator<int,_64UL>::constDequeIterator(&local_58,&rhs->m_finish);
  bVar1 = lexicographical_compare<ft::constDequeIterator<int,64ul>,ft::constDequeIterator<int,64ul>>
                    (&local_d0,&local_a8,&local_80,&local_58,(type *)0x0,(type *)0x0);
  return bVar1;
}

Assistant:

bool operator<(deque<T, Alloc> const & lhs, deque<T, Alloc> const & rhs) {
	return ft::lexicographical_compare(lhs.begin(), lhs.end(), rhs.begin(), rhs.end());
}